

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O2

db_bit * __thiscall lan::db::read_array_bit(db *this,string *name,string *content)

{
  bool bVar1;
  db_bit *pdVar2;
  db_bit *pdVar3;
  logic_error *this_00;
  string sStack_c8;
  string local_a8;
  string local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  pdVar2 = (db_bit *)operator_new(0x50);
  (pdVar2->key)._M_dataplus._M_p = (pointer)&(pdVar2->key).field_2;
  (pdVar2->key)._M_string_length = 0;
  (pdVar2->key).field_2._M_local_buf[0] = '\0';
  pdVar2->data = (void *)0x0;
  pdVar2->pre = (db_bit *)0x0;
  pdVar2->nex = (db_bit *)0x0;
  pdVar2->lin = (db_bit *)0x0;
  pdVar2->con = (db_bit *)0x0;
  std::__cxx11::string::_M_assign((string *)pdVar2);
  pdVar2->type = Array;
  pdVar2->data = (void *)0x0;
  pop_next(&sStack_c8,this,content);
  bVar1 = std::operator!=(&sStack_c8,"[");
  std::__cxx11::string::~string((string *)&sStack_c8);
  if (!bVar1) {
    pdVar3 = get_array_data(this,content);
    pdVar2->lin = pdVar3;
    return pdVar2;
  }
  this_00 = (logic_error *)__cxa_allocate_exception(0x10);
  pop_next(&local_88,this,content);
  std::operator+(&local_68,"LANDB (pull_error): landb: expected <[> before <",&local_88);
  std::operator+(&local_48,&local_68,"> ... ");
  pop_next(&local_a8,this,content);
  std::operator+(&sStack_c8,&local_48,&local_a8);
  std::logic_error::logic_error(this_00,(string *)&sStack_c8);
  __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
}

Assistant:

lan::db_bit * db::read_array_bit(std::string const name, std::string & content){
            db_bit * bit = new db_bit;
            bit->key = name;
            bit->type = Array;
            bit->data = nullptr;
            if(pop_next(content) != "[")
                throw lan::errors::pull_error ("LANDB (pull_error): landb: expected <[> before <" + pop_next(content) + "> ... " + pop_next(content));
            else
                bit->lin = get_array_data(content);
            return bit;
        }